

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void xml_strings(void)

{
  int iVar1;
  int iVar2;
  ctmbstr ptVar3;
  ctmbstr __s2;
  char *pcVar4;
  Bool matches_base;
  Bool skip_current;
  ctmbstr current_label;
  ctmbstr current_language;
  TidyIterator j;
  uint i;
  
  ptVar3 = tidyGetLanguage();
  iVar1 = strcmp(ptVar3,"en");
  ptVar3 = tidyLibraryVersion();
  printf("<?xml version=\"1.0\"?>\n<localized_strings version=\"%s\">\n",ptVar3);
  current_language = (ctmbstr)getStringKeyList();
  while (current_language != (ctmbstr)0x0) {
    j._4_4_ = getNextStringKey((TidyIterator *)&current_language);
    _matches_base = tidyErrorCodeAsKey(j._4_4_);
    iVar2 = strcmp(_matches_base,"UNDEFINED");
    if (iVar2 == 0) {
      _matches_base = "";
    }
    printf("<localized_string id=\"%u\" label=\"%s\">\n",(ulong)j._4_4_,_matches_base);
    printf(" <string class=\"%s\">","en");
    ptVar3 = tidyDefaultString(j._4_4_);
    printf(anon_var_dwarf_142c1 + 0x16,ptVar3);
    printf("</string>\n");
    if (iVar1 != 0) {
      ptVar3 = tidyLocalizedString(j._4_4_);
      __s2 = tidyDefaultString(j._4_4_);
      iVar2 = strcmp(ptVar3,__s2);
      ptVar3 = tidyGetLanguage();
      pcVar4 = "no";
      if (iVar2 == 0) {
        pcVar4 = "yes";
      }
      printf(" <string class=\"%s\" same_as_base=\"%s\">",ptVar3,pcVar4);
      ptVar3 = tidyLocalizedString(j._4_4_);
      printf(anon_var_dwarf_142c1 + 0x16,ptVar3);
      printf("</string>\n");
    }
    printf("</localized_string>\n");
  }
  printf("</localized_strings>\n");
  return;
}

Assistant:

static void xml_strings( void )
{
    uint i;
    TidyIterator j;

    ctmbstr current_language = tidyGetLanguage();
    ctmbstr current_label;
    Bool skip_current = strcmp( current_language, "en" ) == 0;
    Bool matches_base;

    printf( "<?xml version=\"1.0\"?>\n"
           "<localized_strings version=\"%s\">\n", tidyLibraryVersion());

    j = getStringKeyList();
    while (j) {
        i = getNextStringKey(&j);
        current_label = tidyErrorCodeAsKey(i);
        if (!strcmp(current_label, "UNDEFINED"))
            current_label = "";
        printf( "<localized_string id=\"%u\" label=\"%s\">\n", i, current_label );
        printf( " <string class=\"%s\">", "en" );
        printf("%s", tidyDefaultString(i));
        printf( "</string>\n" );
        if ( !skip_current ) {
            matches_base = strcmp( tidyLocalizedString(i), tidyDefaultString(i) ) == 0;
            printf( " <string class=\"%s\" same_as_base=\"%s\">", tidyGetLanguage(), matches_base ? "yes" : "no" );
            printf("%s", tidyLocalizedString(i));
            printf( "</string>\n" );
        }
        printf( "</localized_string>\n");
    }

    printf( "</localized_strings>\n" );
}